

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_lock_posix.cc
# Opt level: O2

RWLockPosix * webrtc::RWLockPosix::Create(void)

{
  bool bVar1;
  RWLockPosix *this;
  
  this = (RWLockPosix *)operator_new(0x40);
  (this->super_RWLockWrapper)._vptr_RWLockWrapper = (_func_int **)&PTR__RWLockPosix_001d4c48;
  (this->lock_).__align = 0;
  *(undefined8 *)((long)&this->lock_ + 8) = 0;
  *(undefined8 *)((long)&this->lock_ + 0x10) = 0;
  *(undefined8 *)((long)&this->lock_ + 0x18) = 0;
  *(undefined8 *)((long)&this->lock_ + 0x20) = 0;
  (this->lock_).__data.__pad2 = 0;
  *(undefined8 *)((long)&this->lock_ + 0x30) = 0;
  bVar1 = Init(this);
  if (!bVar1) {
    (*(this->super_RWLockWrapper)._vptr_RWLockWrapper[1])(this);
    this = (RWLockPosix *)0x0;
  }
  return this;
}

Assistant:

RWLockPosix* RWLockPosix::Create() {
  RWLockPosix* ret_val = new RWLockPosix();
  if (!ret_val->Init()) {
    delete ret_val;
    return NULL;
  }
  return ret_val;
}